

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  PFNGLROTATEFPROC p_Var2;
  bool bVar3;
  int iVar4;
  time_t tVar5;
  GLFWmonitor **ppGVar6;
  GLFWvidmode *pGVar7;
  GLFWwindow *handle;
  char *pcVar8;
  GLFWmonitor *handle_00;
  double dVar9;
  int local_44;
  int monitorCount;
  double local_38;
  
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  glfwSetErrorCallback(error_callback);
  iVar4 = glfwInit();
  if (iVar4 == 0) {
LAB_00110bdd:
    exit(1);
  }
  bVar3 = false;
  do {
    if (bVar3) {
LAB_00110c48:
      local_44 = 0x1e0;
      iVar4 = 0x280;
      bVar1 = true;
      handle_00 = (GLFWmonitor *)0x0;
    }
    else {
      ppGVar6 = glfwGetMonitors(&monitorCount);
      iVar4 = rand();
      handle_00 = ppGVar6[iVar4 % monitorCount];
      if (handle_00 == (GLFWmonitor *)0x0) goto LAB_00110c48;
      pGVar7 = glfwGetVideoMode(handle_00);
      iVar4 = pGVar7->width;
      local_44 = pGVar7->height;
      bVar1 = false;
    }
    local_38 = glfwGetTime();
    handle = glfwCreateWindow(iVar4,local_44,"Window Re-opener",handle_00,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00110bdd;
    }
    glfwMakeContextCurrent(handle);
    gladLoadGLLoader(glfwGetProcAddress);
    glfwSwapInterval(1);
    glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
    glfwSetWindowCloseCallback(handle,window_close_callback);
    glfwSetKeyCallback(handle,key_callback);
    if (bVar1) {
      dVar9 = glfwGetTime();
      printf("Opening regular window took %0.3f seconds\n",dVar9 - local_38);
    }
    else {
      pcVar8 = glfwGetMonitorName(handle_00);
      dVar9 = glfwGetTime();
      printf("Opening full screen window on monitor %s took %0.3f seconds\n",dVar9 - local_38,pcVar8
            );
    }
    (*glad_glMatrixMode)(0x1701);
    (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,1.0,-1.0);
    (*glad_glMatrixMode)(0x1700);
    glfwSetTime(0.0);
    while( true ) {
      dVar9 = glfwGetTime();
      if (5.0 <= dVar9) break;
      (*glad_glClear)(0x4000);
      (*glad_glPushMatrix)();
      p_Var2 = glad_glRotatef;
      dVar9 = glfwGetTime();
      (*p_Var2)((float)dVar9 * 100.0,0.0,0.0,1.0);
      (*glad_glRectf)(-0.5,-0.5,1.0,1.0);
      (*glad_glPopMatrix)();
      glfwSwapBuffers(handle);
      glfwPollEvents();
      iVar4 = glfwWindowShouldClose(handle);
      if (iVar4 != 0) {
        close_window(handle);
        puts("User closed window");
        glfwTerminate();
        exit(0);
      }
    }
    puts("Closing window");
    close_window(handle);
    bVar3 = (bool)(bVar3 ^ 1);
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;

        if (count % 2 == 0)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        window = open_window(width, height, monitor);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glMatrixMode(GL_PROJECTION);
        glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);

            glPushMatrix();
            glRotatef((GLfloat) glfwGetTime() * 100.f, 0.f, 0.f, 1.f);
            glRectf(-0.5f, -0.5f, 1.f, 1.f);
            glPopMatrix();

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}